

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::BasicSyntax::Run(BasicSyntax *this)

{
  CallLogWrapper *this_00;
  size_type sVar1;
  bool bVar2;
  GLuint GVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  pointer __dest;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 uVar7;
  vec3 *in_R9;
  float data [12];
  bool local_ca;
  allocator<char> local_c9;
  ulong local_c8;
  size_type local_c0;
  string local_b8;
  string local_98;
  BasicSyntax *local_78;
  int *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  bVar2 = ShaderStorageBufferObjectBase::SupportedInVS(&this->super_ShaderStorageBufferObjectBase,1)
  ;
  lVar6 = 0x10;
  if (bVar2) {
    local_48 = 0x40400000bf800000;
    uStack_40 = 0x3f80000000000000;
    local_58 = 0xbf80000040400000;
    uStack_50 = 0x3f80000000000000;
    local_68 = 0xbf800000bf800000;
    uStack_60 = 0x3f80000000000000;
    this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_buffer);
    local_c8 = 0;
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_buffer);
    uVar7 = 0x88e4;
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x30,&local_68,0x88e4);
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_vertex_array);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
    local_ca = true;
    local_70 = &DAT_01a9253c;
    local_78 = this;
    do {
      iVar4 = *local_70;
      if (this->m_program != 0) {
        glu::CallLogWrapper::glDeleteProgram(this_00,this->m_program);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,(char *)((long)&DAT_01a9253c + (long)iVar4),&local_c9);
      local_c0 = 0x5d;
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      __dest = (pointer)std::__cxx11::string::_M_create((ulong *)&local_b8,(ulong)&local_c0);
      sVar1 = local_c0;
      local_b8.field_2._M_allocated_capacity = local_c0;
      local_b8._M_dataplus._M_p = __dest;
      memcpy(__dest,
             "\nlayout(location = 0) out vec4 o_color;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n}"
             ,0x5d);
      this = local_78;
      local_b8._M_string_length = sVar1;
      __dest[sVar1] = '\0';
      GVar3 = ShaderStorageBufferObjectBase::CreateProgram
                        (&local_78->super_ShaderStorageBufferObjectBase,&local_98,&local_b8);
      this->m_program = GVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
      bVar2 = ShaderStorageBufferObjectBase::CheckProgram
                        (&this->super_ShaderStorageBufferObjectBase,this->m_program);
      if (!bVar2) break;
      glu::CallLogWrapper::glClear(this_00,0x4000);
      glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
      glu::CallLogWrapper::glDrawArrays(this_00,4,0,3);
      iVar4 = (*((this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                m_context)->m_renderCtx->_vptr_RenderContext[4])();
      iVar4 = *(int *)CONCAT44(extraout_var,iVar4);
      iVar5 = (*((this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                m_context)->m_renderCtx->_vptr_RenderContext[4])();
      local_98._M_dataplus._M_p = (pointer)0x3f80000000000000;
      local_98._M_string_length._0_4_ = 0;
      bVar2 = ShaderStorageBufferObjectBase::ValidateReadBuffer
                        (&this->super_ShaderStorageBufferObjectBase,iVar4,
                         *(int *)(CONCAT44(extraout_var_00,iVar5) + 4),(int)&local_98,(int)uVar7,
                         in_R9);
      if (!bVar2) break;
      local_ca = local_c8 < 7;
      local_c8 = local_c8 + 1;
      local_70 = local_70 + 1;
    } while (local_c8 != 8);
    lVar6 = -(ulong)local_ca;
  }
  return lVar6;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(1))
			return NOT_SUPPORTED;

		const int		  kCount		  = 8;
		const char* const glsl_vs[kCount] = {
			NL "layout(std430) buffer Buffer {" NL "  vec4 position[3];" NL "} g_input_buffer;" NL "void main() {" NL
			   "  gl_Position = g_input_buffer.position[gl_VertexID];" NL "}",
			NL "coherent buffer Buffer {" NL "  buffer vec4 position0;" NL "  coherent vec4 position1;" NL
			   "  restrict readonly vec4 position2;" NL "} g_input_buffer;" NL "void main() {" NL
			   "  if (gl_VertexID == 0) gl_Position = g_input_buffer.position0;" NL
			   "  if (gl_VertexID == 1) gl_Position = g_input_buffer.position1;" NL
			   "  if (gl_VertexID == 2) gl_Position = g_input_buffer.position2;" NL "}",
			NL "layout(std140, binding = 0) readonly buffer Buffer {" NL "  readonly vec4 position[];" NL "};" NL
			   "void main() {" NL "  gl_Position = position[gl_VertexID];" NL "}",
			NL "layout(std430, column_major, std140, std430, row_major, packed, shared) buffer;" NL
			   "layout(std430) buffer;" NL "coherent restrict volatile buffer Buffer {" NL
			   "  restrict coherent vec4 position[];" NL "} g_buffer;" NL "void main() {" NL
			   "  gl_Position = g_buffer.position[gl_VertexID];" NL "}",
			NL "buffer Buffer {" NL "  vec4 position[3];" NL "} g_buffer[1];" NL "void main() {" NL
			   "  gl_Position = g_buffer[0].position[gl_VertexID];" NL "}",
			NL "layout(shared) coherent buffer Buffer {" NL "  restrict volatile vec4 position0;" NL
			   "  buffer readonly vec4 position1;" NL "  vec4 position2;" NL "} g_buffer[1];" NL "void main() {" NL
			   "  if (gl_VertexID == 0) gl_Position = g_buffer[0].position0;" NL
			   "  else if (gl_VertexID == 1) gl_Position = g_buffer[0].position1;" NL
			   "  else if (gl_VertexID == 2) gl_Position = g_buffer[0].position2;" NL "}",
			NL "layout(packed) coherent buffer Buffer {" NL "  vec4 position01[];" NL "  vec4 position2;" NL
			   "} g_buffer;" NL "void main() {" NL "  if (gl_VertexID == 0) gl_Position = g_buffer.position01[0];" NL
			   "  else if (gl_VertexID == 1) gl_Position = g_buffer.position01[1];" NL
			   "  else if (gl_VertexID == 2) gl_Position = g_buffer.position2;" NL "}",
			NL "layout(std430) coherent buffer Buffer {" NL "  coherent vec4 position01[];" NL "  vec4 position2[];" NL
			   "} g_buffer;" NL "void main() {" NL "  switch (gl_VertexID) {" NL
			   "    case 0: gl_Position = g_buffer.position01[0]; break;" NL
			   "    case 1: gl_Position = g_buffer.position01[1]; break;" NL
			   "    case 2: gl_Position = g_buffer.position2[gl_VertexID - 2]; break;" NL "  }" NL "}",
		};
		const char* const glsl_fs = NL "layout(location = 0) out vec4 o_color;" NL "void main() {" NL
									   "  o_color = vec4(0.0, 1.0, 0.0, 1.0);" NL "}";

		// full viewport triangle
		const float data[12] = { -1.0f, -1.0f, 0.0f, 1.0f, 3.0f, -1.0f, 0.0f, 1.0f, -1.0f, 3.0f, 0.0f, 1.0f };
		glGenBuffers(1, &m_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_STATIC_DRAW);

		glGenVertexArrays(1, &m_vertex_array);
		glBindVertexArray(m_vertex_array);

		for (int i = 0; i < kCount; ++i)
		{
			if (!RunIteration(glsl_vs[i], glsl_fs))
				return ERROR;
		}

		return NO_ERROR;
	}